

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O3

ParameterizedTestSuiteInfo<measProblems> * __thiscall
testing::internal::ParameterizedTestSuiteRegistry::GetTestSuitePatternHolder<measProblems>
          (ParameterizedTestSuiteRegistry *this,string *test_suite_name,CodeLocation *code_location)

{
  pointer *pppPVar1;
  pointer pcVar2;
  size_type sVar3;
  iterator __position;
  int iVar4;
  iterator iVar5;
  undefined4 extraout_var;
  ParameterizedTestSuiteInfo<measProblems> *pPVar6;
  ParameterizedTestSuiteInfoBase *pPVar7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  ParameterizedTestSuiteInfo<measProblems> *local_80;
  pointer local_78;
  size_type local_70;
  char local_68;
  undefined7 uStack_67;
  undefined8 uStack_60;
  ParameterizedTestSuiteInfoBase *local_58;
  undefined8 local_50;
  ParameterizedTestSuiteInfoBase local_48;
  undefined8 uStack_40;
  int local_38;
  
  iVar5 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&(this->suite_name_to_info_index_)._M_h,test_suite_name);
  if (iVar5.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
      ._M_cur != (__node_type *)0x0) {
    pPVar7 = (this->test_suite_infos_).
             super__Vector_base<testing::internal::ParameterizedTestSuiteInfoBase_*,_std::allocator<testing::internal::ParameterizedTestSuiteInfoBase_*>_>
             ._M_impl.super__Vector_impl_data._M_start
             [*(long *)((long)iVar5.
                              super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
                              ._M_cur + 0x28)];
    iVar4 = (*pPVar7->_vptr_ParameterizedTestSuiteInfoBase[3])(pPVar7);
    if ((undefined1 *)CONCAT44(extraout_var,iVar4) != &TypeIdHelper<measProblems>::dummy_) {
      ReportInvalidTestSuiteType((test_suite_name->_M_dataplus)._M_p,code_location);
      posix::Abort();
    }
    pPVar6 = CheckedDowncastToActualType<testing::internal::ParameterizedTestSuiteInfo<measProblems>,testing::internal::ParameterizedTestSuiteInfoBase>
                       (pPVar7);
    if (pPVar6 != (ParameterizedTestSuiteInfo<measProblems> *)0x0) {
      return pPVar6;
    }
  }
  pPVar6 = (ParameterizedTestSuiteInfo<measProblems> *)operator_new(0x80);
  pcVar2 = (test_suite_name->_M_dataplus)._M_p;
  local_78 = &local_68;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_78,pcVar2,pcVar2 + test_suite_name->_M_string_length);
  local_58 = &local_48;
  pPVar7 = (ParameterizedTestSuiteInfoBase *)(code_location->file)._M_dataplus._M_p;
  paVar8 = &(code_location->file).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pPVar7 == paVar8) {
    local_48._vptr_ParameterizedTestSuiteInfoBase = (_func_int **)paVar8->_M_allocated_capacity;
    uStack_40 = *(undefined8 *)((long)&(code_location->file).field_2 + 8);
    pPVar7 = local_58;
  }
  else {
    local_48._vptr_ParameterizedTestSuiteInfoBase = (_func_int **)paVar8->_M_allocated_capacity;
  }
  sVar3 = (code_location->file)._M_string_length;
  (code_location->file)._M_dataplus._M_p = (pointer)paVar8;
  (code_location->file)._M_string_length = 0;
  (code_location->file).field_2._M_local_buf[0] = '\0';
  local_38 = code_location->line;
  (pPVar6->super_ParameterizedTestSuiteInfoBase)._vptr_ParameterizedTestSuiteInfoBase =
       (_func_int **)&PTR__ParameterizedTestSuiteInfo_001c7a38;
  paVar8 = &(pPVar6->test_suite_name_).field_2;
  (pPVar6->test_suite_name_)._M_dataplus._M_p = (pointer)paVar8;
  if (local_78 == &local_68) {
    paVar8->_M_allocated_capacity = CONCAT71(uStack_67,local_68);
    *(undefined8 *)((long)&(pPVar6->test_suite_name_).field_2 + 8) = uStack_60;
  }
  else {
    (pPVar6->test_suite_name_)._M_dataplus._M_p = local_78;
    (pPVar6->test_suite_name_).field_2._M_allocated_capacity = CONCAT71(uStack_67,local_68);
  }
  (pPVar6->test_suite_name_)._M_string_length = local_70;
  local_70 = 0;
  local_68 = '\0';
  paVar8 = &(pPVar6->code_location_).file.field_2;
  (pPVar6->code_location_).file._M_dataplus._M_p = (pointer)paVar8;
  if (pPVar7 == local_58) {
    paVar8->_M_allocated_capacity = (size_type)local_48._vptr_ParameterizedTestSuiteInfoBase;
    *(undefined8 *)((long)&(pPVar6->code_location_).file.field_2 + 8) = uStack_40;
  }
  else {
    (pPVar6->code_location_).file._M_dataplus._M_p = (pointer)pPVar7;
    (pPVar6->code_location_).file.field_2._M_allocated_capacity =
         (size_type)local_48._vptr_ParameterizedTestSuiteInfoBase;
  }
  (pPVar6->code_location_).file._M_string_length = sVar3;
  local_50 = 0;
  local_48._vptr_ParameterizedTestSuiteInfoBase =
       local_48._vptr_ParameterizedTestSuiteInfoBase & 0xffffffffffffff00;
  (pPVar6->code_location_).line = local_38;
  (pPVar6->tests_).
  super__Vector_base<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<measProblems>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<measProblems>::TestInfo>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (pPVar6->tests_).
  super__Vector_base<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<measProblems>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<measProblems>::TestInfo>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (pPVar6->tests_).
  super__Vector_base<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<measProblems>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<measProblems>::TestInfo>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (pPVar6->instantiations_).
  super__Vector_base<testing::internal::ParameterizedTestSuiteInfo<measProblems>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestSuiteInfo<measProblems>::InstantiationInfo>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (pPVar6->instantiations_).
  super__Vector_base<testing::internal::ParameterizedTestSuiteInfo<measProblems>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestSuiteInfo<measProblems>::InstantiationInfo>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (pPVar6->instantiations_).
  super__Vector_base<testing::internal::ParameterizedTestSuiteInfo<measProblems>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestSuiteInfo<measProblems>::InstantiationInfo>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_80 = (ParameterizedTestSuiteInfo<measProblems> *)
             ((long)(this->test_suite_infos_).
                    super__Vector_base<testing::internal::ParameterizedTestSuiteInfoBase_*,_std::allocator<testing::internal::ParameterizedTestSuiteInfoBase_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(this->test_suite_infos_).
                    super__Vector_base<testing::internal::ParameterizedTestSuiteInfoBase_*,_std::allocator<testing::internal::ParameterizedTestSuiteInfoBase_*>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 3);
  local_78 = &local_68;
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_long>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::_M_emplace<std::__cxx11::string,unsigned_long>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_long>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)&this->suite_name_to_info_index_,test_suite_name,&local_80);
  __position._M_current =
       (this->test_suite_infos_).
       super__Vector_base<testing::internal::ParameterizedTestSuiteInfoBase_*,_std::allocator<testing::internal::ParameterizedTestSuiteInfoBase_*>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->test_suite_infos_).
      super__Vector_base<testing::internal::ParameterizedTestSuiteInfoBase_*,_std::allocator<testing::internal::ParameterizedTestSuiteInfoBase_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    local_80 = pPVar6;
    std::
    vector<testing::internal::ParameterizedTestSuiteInfoBase*,std::allocator<testing::internal::ParameterizedTestSuiteInfoBase*>>
    ::_M_realloc_insert<testing::internal::ParameterizedTestSuiteInfoBase*>
              ((vector<testing::internal::ParameterizedTestSuiteInfoBase*,std::allocator<testing::internal::ParameterizedTestSuiteInfoBase*>>
                *)this,__position,(ParameterizedTestSuiteInfoBase **)&local_80);
  }
  else {
    *__position._M_current = (ParameterizedTestSuiteInfoBase *)pPVar6;
    pppPVar1 = &(this->test_suite_infos_).
                super__Vector_base<testing::internal::ParameterizedTestSuiteInfoBase_*,_std::allocator<testing::internal::ParameterizedTestSuiteInfoBase_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    *pppPVar1 = *pppPVar1 + 1;
  }
  return pPVar6;
}

Assistant:

ParameterizedTestSuiteInfo<TestSuite>* GetTestSuitePatternHolder(
      std::string test_suite_name, CodeLocation code_location) {
    ParameterizedTestSuiteInfo<TestSuite>* typed_test_info = nullptr;

    auto item_it = suite_name_to_info_index_.find(test_suite_name);
    if (item_it != suite_name_to_info_index_.end()) {
      auto* test_suite_info = test_suite_infos_[item_it->second];
      if (test_suite_info->GetTestSuiteTypeId() != GetTypeId<TestSuite>()) {
        // Complain about incorrect usage of Google Test facilities
        // and terminate the program since we cannot guaranty correct
        // test suite setup and tear-down in this case.
        ReportInvalidTestSuiteType(test_suite_name.c_str(), code_location);
        posix::Abort();
      } else {
        // At this point we are sure that the object we found is of the same
        // type we are looking for, so we downcast it to that type
        // without further checks.
        typed_test_info =
            CheckedDowncastToActualType<ParameterizedTestSuiteInfo<TestSuite>>(
                test_suite_info);
      }
    }
    if (typed_test_info == nullptr) {
      typed_test_info = new ParameterizedTestSuiteInfo<TestSuite>(
          test_suite_name, std::move(code_location));
      suite_name_to_info_index_.emplace(std::move(test_suite_name),
                                        test_suite_infos_.size());
      test_suite_infos_.push_back(typed_test_info);
    }
    return typed_test_info;
  }